

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O1

void bifcvs(bifcxdef *ctx,int argc)

{
  runcxdef *prVar1;
  int len;
  runsdef *prVar2;
  uint uVar4;
  char *pcVar5;
  char buf [30];
  char acStack_38 [40];
  size_t sVar3;
  
  pcVar5 = acStack_38;
  prVar1 = ctx->bifcxrun;
  uVar4 = (uint)prVar1->runcxsp[-1].runstyp;
  if (7 < uVar4 - 1) {
switchD_0021162a_caseD_2:
    prVar1->runcxerr->errcxptr->erraav[0].errastr = "cvtstr";
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 1;
    runsign(ctx->bifcxrun,0x3ff);
  }
  prVar2 = prVar1->runcxsp + -1;
  switch(uVar4) {
  case 1:
    prVar1->runcxsp = prVar2;
    if (prVar2->runstyp != '\x01') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3eb);
    }
    sprintf(acStack_38,"%ld",(ctx->bifcxrun->runcxsp->runsv).runsvnum);
    sVar3 = strlen(acStack_38);
    len = (int)sVar3;
    goto LAB_0021169a;
  default:
    goto switchD_0021162a_caseD_2;
  case 3:
    goto switchD_0021162a_caseD_3;
  case 5:
    prVar1->runcxsp = prVar2;
    len = 3;
    pcVar5 = "pushnil";
    break;
  case 8:
    prVar1->runcxsp = prVar2;
    len = 4;
    pcVar5 = "pushtrue";
  }
  pcVar5 = pcVar5 + 4;
  if ((prVar2->runstyp != '\b') && (ctx->bifcxrun->runcxsp->runstyp != '\x05')) {
    ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
    runsign(ctx->bifcxrun,0x3ed);
  }
LAB_0021169a:
  runpstr(ctx->bifcxrun,pcVar5,len,0);
switchD_0021162a_caseD_3:
  return;
}

Assistant:

void bifcvs(bifcxdef *ctx, int argc)
{
    char *p;
    int   len;
    char  buf[30];
    
    bifcntargs(ctx, 1, argc);
    switch(runtostyp(ctx->bifcxrun))
    {
    case DAT_NIL:
        p = "nil";
        len = 3;
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    case DAT_TRUE:
        p = "true";
        len = 4;
        (void)runpoplog(ctx->bifcxrun);
        break;
        
    case DAT_NUMBER:
        sprintf(buf, "%ld", runpopnum(ctx->bifcxrun));
        p = buf;
        len = strlen(buf);
        break;

    case DAT_SSTRING:
        /* leave the string value on the stack unchanged */
        return;

    default:
        /* throw the RUNEXITOBJ error */
        runsig1(ctx->bifcxrun, ERR_INVTBIF, ERRTSTR, "cvtstr");
    }
    
    runpstr(ctx->bifcxrun, p, len, 0);
}